

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O0

bool __thiscall wasm::anon_unknown_0::SubTyper::isSubType(SubTyper *this,HeapType a,HeapType b)

{
  bool bVar1;
  bool bVar2;
  BasicHeapType BVar3;
  HeapTypeInfo *pHVar4;
  bool local_8b;
  bool local_8a;
  bool local_89;
  HeapTypeInfo *local_68;
  HeapTypeInfo *curr;
  BasicHeapType local_58 [8];
  HeapType local_38;
  HeapType aUnshared;
  BasicHeapType aTop;
  SubTyper *this_local;
  HeapType b_local;
  HeapType a_local;
  
  this_local = (SubTyper *)b.id;
  b_local = a;
  bVar1 = HeapType::operator==(&b_local,(HeapType *)&this_local);
  if (bVar1) {
    return true;
  }
  bVar1 = HeapType::isShared(&b_local);
  bVar2 = HeapType::isShared((HeapType *)&this_local);
  if (bVar1 != bVar2) {
    return false;
  }
  bVar1 = HeapType::isBasic((HeapType *)&this_local);
  if (bVar1) {
    aUnshared.id._4_4_ = HeapType::getUnsharedTop(&b_local);
    bVar1 = HeapType::isBasic(&b_local);
    if (bVar1) {
      BVar3 = HeapType::getBasic(&b_local,Unshared);
      HeapType::HeapType(&local_38,BVar3);
    }
    else {
      local_38.id = b_local.id;
    }
    BVar3 = HeapType::getBasic((HeapType *)&this_local,Unshared);
    switch(BVar3) {
    case ext:
      a_local.id._7_1_ = aUnshared.id._4_4_ == ext;
      break;
    default:
      goto LAB_026758e0;
    case func:
      a_local.id._7_1_ = aUnshared.id._4_4_ == func;
      break;
    case cont:
      a_local.id._7_1_ = aUnshared.id._4_4_ == cont;
      break;
    case any:
      a_local.id._7_1_ = aUnshared.id._4_4_ == any;
      break;
    case eq:
      local_58[7] = 0x30;
      bVar1 = HeapType::operator==(&local_38,local_58 + 7);
      local_89 = true;
      if (!bVar1) {
        local_58[6] = 0x58;
        bVar1 = HeapType::operator==(&local_38,local_58 + 6);
        local_89 = true;
        if (!bVar1) {
          local_58[5] = 0x38;
          bVar1 = HeapType::operator==(&local_38,local_58 + 5);
          local_89 = true;
          if (!bVar1) {
            local_58[4] = 0x40;
            bVar1 = HeapType::operator==(&local_38,local_58 + 4);
            local_89 = true;
            if (!bVar1) {
              bVar1 = HeapType::isStruct(&b_local);
              local_89 = true;
              if (!bVar1) {
                local_89 = HeapType::isArray(&b_local);
              }
            }
          }
        }
      }
      a_local.id._7_1_ = local_89;
      break;
    case i31:
      local_58[3] = 0x58;
      a_local.id._7_1_ = HeapType::operator==(&local_38,local_58 + 3);
      break;
    case struct_:
      local_58[1] = 0x58;
      bVar1 = HeapType::operator==(&local_38,local_58 + 1);
      local_8a = true;
      if (!bVar1) {
        local_8a = HeapType::isStruct(&b_local);
      }
      a_local.id._7_1_ = local_8a;
      break;
    case array:
      local_58[0] = none;
      bVar1 = HeapType::operator==(&local_38,local_58);
      local_8b = true;
      if (!bVar1) {
        local_8b = HeapType::isArray(&b_local);
      }
      a_local.id._7_1_ = local_8b;
      break;
    case exn:
      a_local.id._7_1_ = aUnshared.id._4_4_ == exn;
      break;
    case string:
      local_58[2] = 0x60;
      a_local.id._7_1_ = HeapType::operator==(&local_38,local_58 + 2);
      break;
    case none:
    case noext:
    case nofunc:
    case nocont:
    case noexn:
      a_local.id._7_1_ = false;
    }
  }
  else {
LAB_026758e0:
    bVar1 = HeapType::isBasic(&b_local);
    if (bVar1) {
      curr._4_4_ = HeapType::getBottom((HeapType *)&this_local);
      a_local.id._7_1_ = HeapType::operator==(&b_local,(BasicHeapType *)((long)&curr + 4));
    }
    else {
      local_68 = getHeapTypeInfo(b_local);
      do {
        local_68 = local_68->supertype;
        if (local_68 == (HeapTypeInfo *)0x0) {
          return false;
        }
        pHVar4 = getHeapTypeInfo((HeapType)this_local);
      } while (local_68 != pHVar4);
      a_local.id._7_1_ = true;
    }
  }
  return a_local.id._7_1_;
}

Assistant:

bool SubTyper::isSubType(HeapType a, HeapType b) {
  // See:
  // https://github.com/WebAssembly/function-references/blob/master/proposals/function-references/Overview.md#subtyping
  // https://github.com/WebAssembly/gc/blob/master/proposals/gc/MVP.md#defined-types
  if (a == b) {
    return true;
  }
  if (a.isShared() != b.isShared()) {
    return false;
  }
  if (b.isBasic()) {
    auto aTop = a.getUnsharedTop();
    auto aUnshared = a.isBasic() ? a.getBasic(Unshared) : a;
    switch (b.getBasic(Unshared)) {
      case HeapType::ext:
        return aTop == HeapType::ext;
      case HeapType::func:
        return aTop == HeapType::func;
      case HeapType::cont:
        return aTop == HeapType::cont;
      case HeapType::exn:
        return aTop == HeapType::exn;
      case HeapType::any:
        return aTop == HeapType::any;
      case HeapType::eq:
        return aUnshared == HeapType::i31 || aUnshared == HeapType::none ||
               aUnshared == HeapType::struct_ || aUnshared == HeapType::array ||
               a.isStruct() || a.isArray();
      case HeapType::i31:
        return aUnshared == HeapType::none;
      case HeapType::string:
        return aUnshared == HeapType::noext;
      case HeapType::struct_:
        return aUnshared == HeapType::none || a.isStruct();
      case HeapType::array:
        return aUnshared == HeapType::none || a.isArray();
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
      case HeapType::nocont:
      case HeapType::noexn:
        return false;
    }
  }
  if (a.isBasic()) {
    // Basic HeapTypes are only subtypes of compound HeapTypes if they are
    // bottom types.
    return a == b.getBottom();
  }
  // Subtyping must be declared rather than derived from structure, so we will
  // not recurse. TODO: optimize this search with some form of caching.
  HeapTypeInfo* curr = getHeapTypeInfo(a);
  while ((curr = curr->supertype)) {
    if (curr == getHeapTypeInfo(b)) {
      return true;
    }
  }
  return false;
}